

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::cmLocalUnixMakefileGenerator3
          (cmLocalUnixMakefileGenerator3 *this,cmGlobalGenerator *gg,cmLocalGenerator *parent,
          Snapshot snapshot)

{
  cmLocalGenerator *parent_local;
  cmGlobalGenerator *gg_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  cmLocalGenerator::cmLocalGenerator(&this->super_cmLocalGenerator,gg,parent,snapshot);
  (this->super_cmLocalGenerator)._vptr_cmLocalGenerator =
       (_func_int **)&PTR__cmLocalUnixMakefileGenerator3_00af85f8;
  ImplicitDependTargetMap::ImplicitDependTargetMap(&this->ImplicitDepends);
  std::__cxx11::string::string((string *)&this->ConfigurationName);
  std::__cxx11::string::string((string *)&this->HomeRelativeOutputPath);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->LocalHelp);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->MakeVariableMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->ShortMakeVariableMap);
  this->MakefileVariableSize = 0;
  this->ColorMakefile = false;
  this->SkipPreprocessedSourceRules = false;
  this->SkipAssemblySourceRules = false;
  this->MakeCommandEscapeTargetTwice = false;
  this->BorlandMakeCurlyHack = false;
  return;
}

Assistant:

cmLocalUnixMakefileGenerator3::
cmLocalUnixMakefileGenerator3(cmGlobalGenerator* gg, cmLocalGenerator* parent,
                              cmState::Snapshot snapshot)
  : cmLocalGenerator(gg, parent, snapshot)
{
  this->MakefileVariableSize = 0;
  this->ColorMakefile = false;
  this->SkipPreprocessedSourceRules = false;
  this->SkipAssemblySourceRules = false;
  this->MakeCommandEscapeTargetTwice = false;
  this->BorlandMakeCurlyHack = false;
}